

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O0

void __thiscall HoldingProperty_MoveOwner_Test::TestBody(HoldingProperty_MoveOwner_Test *this)

{
  HoldingProperty<HoldingMovableType,_IdHolder,_4UL,_prop::ReadOnly> *this_00;
  HoldingMovableType *pHVar1;
  HoldingMovableType *this_01;
  bool bVar2;
  Movable *pMVar3;
  char *pcVar4;
  AssertHelper local_1c0;
  Message local_1b8;
  int local_1b0 [2];
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_7;
  Message local_190;
  int local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_6;
  Message local_168;
  int local_160 [2];
  undefined1 local_158 [8];
  AssertionResult gtest_ar_5;
  Message local_140;
  int local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  HoldingMovableType obj2;
  Message local_100;
  int local_f8 [2];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  HoldingMovableType move_to;
  Message local_98;
  int local_90 [2];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  int local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  HoldingMovableType copy_to;
  int remembered_value;
  HoldingMovableType obj;
  HoldingProperty_MoveOwner_Test *this_local;
  
  this_00 = &copy_to.ro_value2;
  HoldingMovableType::HoldingMovableType((HoldingMovableType *)this_00);
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)this_00);
  copy_to.value3.super_PropertyHoldingBase<IdHolder>.m_value.id =
       (PropertyHoldingBase<IdHolder>)Movable::getId(pMVar3);
  pHVar1 = (HoldingMovableType *)((long)&gtest_ar.message_.ptr_ + 4);
  HoldingMovableType::HoldingMovableType(pHVar1,(HoldingMovableType *)this_00);
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)pHVar1);
  local_54 = Movable::getId(pMVar3);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_50,"remembered_value","copy_to.value1().getId()",
             (int *)&copy_to.value3,&local_54);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar2) {
    testing::Message::Message(local_70);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x25b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_90[1] = 0;
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)&copy_to.ro_value2);
  local_90[0] = Movable::getId(pMVar3);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_88,"0","obj.value1().getId()",local_90 + 1,local_90);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(&local_98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&move_to.value3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x25c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&move_to.value3,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&move_to.value3);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  pHVar1 = (HoldingMovableType *)((long)&gtest_ar_2.message_.ptr_ + 4);
  HoldingMovableType::HoldingMovableType(pHVar1,(HoldingMovableType *)&copy_to.ro_value2);
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)pHVar1);
  local_cc = Movable::getId(pMVar3);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_c8,"remembered_value","move_to.value1().getId()",
             (int *)&copy_to.value3,&local_cc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x25f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_f8[1] = 0;
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)&copy_to.ro_value2);
  local_f8[0] = Movable::getId(pMVar3);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)local_f0,"0",(int *)"obj.value1().getId()",local_f8 + 1,local_f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&obj2.value3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x260,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&obj2.value3,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&obj2.value3);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  this_01 = (HoldingMovableType *)((long)&gtest_ar_4.message_.ptr_ + 4);
  HoldingMovableType::HoldingMovableType(this_01);
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)this_01);
  copy_to.value3.super_PropertyHoldingBase<IdHolder>.m_value.id =
       (PropertyHoldingBase<IdHolder>)Movable::getId(pMVar3);
  pHVar1 = (HoldingMovableType *)((long)&gtest_ar.message_.ptr_ + 4);
  HoldingMovableType::operator=(pHVar1,this_01);
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)pHVar1);
  local_134 = Movable::getId(pMVar3);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_130,"remembered_value","copy_to.value1().getId()",
             (int *)&copy_to.value3,&local_134);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_140);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x266,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_160[1] = 0;
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)((long)&gtest_ar_4.message_.ptr_ + 4));
  local_160[0] = Movable::getId(pMVar3);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_158,"0","obj2.value1().getId()",local_160 + 1,local_160);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar2) {
    testing::Message::Message(&local_168);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x267,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  pHVar1 = (HoldingMovableType *)((long)&gtest_ar_2.message_.ptr_ + 4);
  HoldingMovableType::operator=(pHVar1,(HoldingMovableType *)((long)&gtest_ar_4.message_.ptr_ + 4));
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)pHVar1);
  local_184 = Movable::getId(pMVar3);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_180,"remembered_value","move_to.value1().getId()",
             (int *)&copy_to.value3,&local_184);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar2) {
    testing::Message::Message(&local_190);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x26a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1b0[1] = 0;
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)((long)&gtest_ar_4.message_.ptr_ + 4));
  local_1b0[0] = Movable::getId(pMVar3);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)local_1a8,"0",(int *)"obj2.value1().getId()",local_1b0 + 1,local_1b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(&local_1b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x26b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  return;
}

Assistant:

TEST(HoldingProperty, MoveOwner)
{
  HoldingMovableType obj;

  auto remembered_value = obj.value1().getId();
  HoldingMovableType copy_to{ obj };
  EXPECT_NE( remembered_value, copy_to.value1().getId() );
  EXPECT_NE( 0, obj.value1().getId() );
  
  HoldingMovableType move_to{ std::move( obj ) };
  EXPECT_EQ( remembered_value, move_to.value1().getId() );
  EXPECT_EQ( 0, obj.value1().getId() );
  
  HoldingMovableType obj2;
  
  remembered_value = obj2.value1().getId();
  copy_to = obj2;
  EXPECT_NE( remembered_value, copy_to.value1().getId() );
  EXPECT_NE( 0, obj2.value1().getId() );
  
  move_to = std::move( obj2 );
  EXPECT_EQ( remembered_value, move_to.value1().getId() );
  EXPECT_EQ( 0, obj2.value1().getId() );
}